

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# columnref_expression.cpp
# Opt level: O3

string * __thiscall
duckdb::ColumnRefExpression::GetName_abi_cxx11_
          (string *__return_storage_ptr__,ColumnRefExpression *this)

{
  pointer pcVar1;
  const_reference pvVar2;
  
  if ((this->super_ParsedExpression).super_BaseExpression.alias._M_string_length == 0) {
    pvVar2 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::back(&this->column_names);
  }
  else {
    pvVar2 = &(this->super_ParsedExpression).super_BaseExpression.alias;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (pvVar2->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + pvVar2->_M_string_length);
  return __return_storage_ptr__;
}

Assistant:

string ColumnRefExpression::GetName() const {
	return !alias.empty() ? alias : column_names.back();
}